

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EhFrame.cpp
# Opt level: O3

BYTE * EmitLEB128(BYTE *pc,int value)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  
  do {
    pbVar1 = pc;
    bVar2 = (byte)value & 0x7f;
    if ((uint)value < 0x40) {
      *pbVar1 = bVar2;
      break;
    }
    bVar3 = value >> 7 != 0xffffffff || (value & 0x40U) == 0;
    *pbVar1 = bVar3 << 7 | bVar2;
    pc = pbVar1 + 1;
    value = value >> 7;
  } while (bVar3);
  return pbVar1 + 1;
}

Assistant:

BYTE* EmitLEB128(BYTE* pc, int value)
{
    static const int size = sizeof(value) * 8;
    static const bool isLogicShift = (-1 >> 1) != -1;

    const bool signExtend = isLogicShift && value < 0;

    bool more = true;
    while (more)
    {
        BYTE b = value & 0x7F; // low order 7 bits
        value >>= 7;

        if (signExtend)
        {
            value |= - (1 << (size - 7)); // sign extend
        }

        const bool signBit = (b & 0x40) != 0;
        if ((value == 0 && !signBit) || (value == -1 && signBit))
        {
            more = false;
        }
        else
        {
            b |= 0x80;
        }

        *pc++ = b;
    }

    return pc;
}